

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall cmMakefile::PopScope(cmMakefile *this)

{
  Internals *this_00;
  
  cmFileLockPool::PopFunctionScope(&this->LocalGenerator->GlobalGenerator->FileLockPool);
  PopLoopBlockBarrier(this);
  CheckForUnusedVariables(this);
  this_00 = (this->Internal).x_;
  std::__cxx11::list<cmDefinitions,_std::allocator<cmDefinitions>_>::_M_erase
            (&this_00->VarStack,
             (this_00->VarStack).super__List_base<cmDefinitions,_std::allocator<cmDefinitions>_>.
             _M_impl._M_node.super__List_node_base._M_prev);
  return;
}

Assistant:

void cmMakefile::PopScope()
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  this->GetGlobalGenerator()->GetFileLockPool().PopFunctionScope();
#endif

  this->PopLoopBlockBarrier();

  this->CheckForUnusedVariables();

  this->Internal->PopDefinitions();
}